

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDGrammar.hpp
# Opt level: O1

DTDEntityDecl * __thiscall xercesc_4_0::DTDGrammar::getEntityDecl(DTDGrammar *this,XMLCh *entName)

{
  NameIdPool<xercesc_4_0::DTDEntityDecl> *pNVar1;
  bool bVar2;
  ulong uVar3;
  DTDEntityDecl *pDVar4;
  XMLCh *pXVar5;
  XMLCh XVar6;
  long *plVar7;
  StringHasher *this_00;
  RefHashTableBucketElem<xercesc_4_0::DTDEntityDecl> *pRVar8;
  
  if (*(long *)(fDefaultEntities + 0x18) != 0) {
    if ((entName == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*entName, uVar3 == 0)) {
      uVar3 = 0;
    }
    else {
      XVar6 = entName[1];
      if (XVar6 != L'\0') {
        pXVar5 = entName + 2;
        do {
          uVar3 = (ulong)(ushort)XVar6 + (uVar3 >> 0x18) + uVar3 * 0x26;
          XVar6 = *pXVar5;
          pXVar5 = pXVar5 + 1;
        } while (XVar6 != L'\0');
      }
      uVar3 = uVar3 % *(ulong *)(fDefaultEntities + 0x38);
    }
    plVar7 = *(long **)(*(long *)(fDefaultEntities + 0x30) + uVar3 * 8);
    if (plVar7 != (long *)0x0) {
      this_00 = (StringHasher *)(fDefaultEntities + 0x50);
      do {
        bVar2 = StringHasher::equals(this_00,entName,(void *)plVar7[2]);
        if (bVar2) goto LAB_002a3209;
        plVar7 = (long *)plVar7[1];
      } while (plVar7 != (long *)0x0);
    }
    plVar7 = (long *)0x0;
LAB_002a3209:
    if (plVar7 != (long *)0x0) {
      pDVar4 = (DTDEntityDecl *)*plVar7;
      goto LAB_002a3216;
    }
  }
  pDVar4 = (DTDEntityDecl *)0x0;
LAB_002a3216:
  if (pDVar4 == (DTDEntityDecl *)0x0) {
    pNVar1 = this->fEntityDeclPool;
    if (pNVar1->fIdCounter != 0) {
      if ((entName == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*entName, uVar3 == 0)) {
        uVar3 = 0;
      }
      else {
        XVar6 = entName[1];
        if (XVar6 != L'\0') {
          pXVar5 = entName + 2;
          do {
            uVar3 = (ulong)(ushort)XVar6 + (uVar3 >> 0x18) + uVar3 * 0x26;
            XVar6 = *pXVar5;
            pXVar5 = pXVar5 + 1;
          } while (XVar6 != L'\0');
        }
        uVar3 = uVar3 % (pNVar1->fBucketList).fHashModulus;
      }
      pRVar8 = (pNVar1->fBucketList).fBucketList[uVar3];
      if (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::DTDEntityDecl> *)0x0) {
        do {
          bVar2 = StringHasher::equals
                            ((StringHasher *)&(pNVar1->fBucketList).field_0x30,entName,pRVar8->fKey)
          ;
          if (bVar2) goto LAB_002a32aa;
          pRVar8 = pRVar8->fNext;
        } while (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::DTDEntityDecl> *)0x0);
      }
      pRVar8 = (RefHashTableBucketElem<xercesc_4_0::DTDEntityDecl> *)0x0;
LAB_002a32aa:
      if (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::DTDEntityDecl> *)0x0) {
        return pRVar8->fData;
      }
    }
    pDVar4 = (DTDEntityDecl *)0x0;
  }
  return pDVar4;
}

Assistant:

inline DTDEntityDecl* DTDGrammar::getEntityDecl(const XMLCh* const entName)
{
    DTDEntityDecl* decl = fDefaultEntities->getByKey(entName);

    if (!decl)
        return fEntityDeclPool->getByKey(entName);

    return decl;
}